

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O2

int ed25519_set_priv_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  uint8_t *out_private_key;
  int iVar1;
  uint8_t pubkey_unused [32];
  
  if (len == 0x20) {
    out_private_key = (uint8_t *)OPENSSL_malloc(0x41);
    if (out_private_key == (uint8_t *)0x0) {
      iVar1 = 0;
    }
    else {
      ED25519_keypair_from_seed(pubkey_unused,out_private_key,in);
      out_private_key[0x40] = '\x01';
      ed25519_free(pkey);
      pkey->pkey = out_private_key;
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                  ,0x21);
  }
  return iVar1;
}

Assistant:

static int ed25519_set_priv_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  ED25519_KEY *key =
      reinterpret_cast<ED25519_KEY *>(OPENSSL_malloc(sizeof(ED25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  // The RFC 8032 encoding stores only the 32-byte seed, so we must recover the
  // full representation which we use from it.
  uint8_t pubkey_unused[32];
  ED25519_keypair_from_seed(pubkey_unused, key->key, in);
  key->has_private = 1;

  ed25519_free(pkey);
  pkey->pkey = key;
  return 1;
}